

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
InsertHint<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>_>
::TestBody(InsertHint<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>_>
           *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 rhs;
  mt19937_64 *__urng;
  pointer *__ptr;
  long lVar3;
  char *pcVar4;
  _Head_base<0UL,_const_phmap::priv::hash_internal::EnumClass_&,_false> *p_Var5;
  pair<const_phmap::priv::hash_internal::EnumClass,_int> pVar6;
  AssertionResult gtest_ar_;
  T val2;
  AssertionResult gtest_ar;
  TypeParam m;
  AssertHelper local_790;
  _Head_base<0UL,_const_phmap::priv::hash_internal::EnumClass_&,_false> local_788;
  _Head_base<0UL,_const_int_&,_false> local_780;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_778;
  result_type_conflict1 local_770 [2];
  undefined1 local_768 [8];
  Inner *local_760;
  __native_type local_758;
  AssertHelper local_730;
  pair<const_phmap::priv::hash_internal::EnumClass,_int> local_728;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  local_718;
  
  pVar6 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    ((Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void> *
                     )&local_718);
  local_728.first = pVar6.first;
  local_780._M_head_impl = &local_728.second;
  local_728.second = pVar6.second;
  lVar3 = 0x68;
  do {
    *(undefined8 *)((long)&local_758 + lVar3 + 8) = 0;
    *(undefined8 *)((long)&local_758 + lVar3 + 0x10) = 0;
    *(undefined8 *)((long)&local_760 + lVar3) = 0;
    *(undefined8 *)((long)&local_758 + lVar3) = 0;
    *(undefined8 *)((long)local_770 + lVar3) = 0;
    *(undefined8 *)(local_768 + lVar3) = 0;
    *(undefined8 *)((long)&local_780._M_head_impl + lVar3) = 0;
    *(undefined8 *)((long)local_770 + lVar3 + -8) = 0;
    *(undefined8 *)((long)&local_758 + lVar3 + 0x18) = 0;
    *(undefined8 *)((long)&local_730.data_ + lVar3) = 0;
    *(long *)((long)local_718.sets_._M_elems + lVar3 + -0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)local_718.sets_._M_elems + lVar3 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)
     ((long)&local_718.sets_._M_elems[0].super_Lockable.super_mutex.super___mutex_base._M_mutex +
     lVar3) = 0;
    lVar3 = lVar3 + 0x70;
  } while (lVar3 != 0x768);
  local_788._M_head_impl = &local_728.first;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_728.first;
  p_Var5 = &local_788;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::
  emplace_decomposable_with_hash<phmap::priv::hash_internal::EnumClass,std::piecewise_construct_t_const&,std::tuple<phmap::priv::hash_internal::EnumClass_const&>,std::tuple<int_const&>>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator,_bool>
              *)local_768,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
              *)&local_718,local_788._M_head_impl,
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,
             (tuple<const_phmap::priv::hash_internal::EnumClass_&> *)p_Var5,
             (tuple<const_int_&> *)&local_780);
  rhs = local_758._8_8_;
  local_788._M_head_impl._0_1_ = local_768 != (undefined1  [8])0x0;
  local_780._M_head_impl = (int *)0x0;
  if (local_768 == (undefined1  [8])0x0) {
    testing::Message::Message((Message *)&local_778);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_768,(internal *)&local_788,(AssertionResult *)"it != m.end()","false"
               ,"true",(char *)p_Var5);
    testing::internal::AssertHelper::AssertHelper
              (&local_790,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x47,(char *)local_768);
    testing::internal::AssertHelper::operator=(&local_790,(Message *)&local_778);
    testing::internal::AssertHelper::~AssertHelper(&local_790);
    if (local_768 != (undefined1  [8])&local_758) {
      operator_delete((void *)local_768,(ulong)(local_758.__align + 1));
    }
    if (local_778._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_778._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_780._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_780,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_780._M_head_impl);
  }
  testing::internal::
  CmpHelperEQ<std::pair<phmap::priv::hash_internal::EnumClass_const,int>,std::pair<phmap::priv::hash_internal::EnumClass_const,int>>
            ((internal *)local_768,"val","*it",&local_728,
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)rhs);
  if (local_768[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_788);
    if (local_760 == (Inner *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)(local_760->super_Lockable).super_mutex.super___mutex_base._M_mutex.__align;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_778,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x48,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_778,(Message *)&local_788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_778);
    if (local_788._M_head_impl != (EnumClass *)0x0) {
      (**(code **)(*local_788._M_head_impl + 8))();
    }
  }
  if (local_760 != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_760,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_760);
  }
  local_768 = (undefined1  [8])0x7fffffff00000000;
  __urng = hash_internal::GetSharedRng();
  local_770[0] = std::uniform_int_distribution<int>::operator()
                           ((uniform_int_distribution<int> *)local_768,__urng,
                            (param_type *)local_768);
  local_780._M_head_impl = local_770;
  local_778._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_728.first;
  local_788._M_head_impl = (EnumClass *)&local_778;
  p_Var5 = &local_788;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_728.first;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::
  emplace_decomposable_with_hash<phmap::priv::hash_internal::EnumClass,std::piecewise_construct_t_const&,std::tuple<phmap::priv::hash_internal::EnumClass_const&>,std::tuple<int_const&>>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator,_bool>
              *)local_768,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
              *)&local_718,local_788._M_head_impl,
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,
             (tuple<const_phmap::priv::hash_internal::EnumClass_&> *)p_Var5,
             (tuple<const_int_&> *)&local_780);
  local_788._M_head_impl._0_1_ = local_768 != (undefined1  [8])0x0;
  local_780._M_head_impl = (int *)0x0;
  if (local_768 == (undefined1  [8])0x0) {
    testing::Message::Message((Message *)&local_790);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_768,(internal *)&local_788,(AssertionResult *)"it != m.end()","false"
               ,"true",(char *)p_Var5);
    testing::internal::AssertHelper::AssertHelper
              (&local_730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x4b,(char *)local_768);
    testing::internal::AssertHelper::operator=(&local_730,(Message *)&local_790);
    testing::internal::AssertHelper::~AssertHelper(&local_730);
    if (local_768 != (undefined1  [8])&local_758) {
      operator_delete((void *)local_768,(ulong)(local_758.__align + 1));
    }
    if (local_790.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_790.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_780._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_780,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_780._M_head_impl);
  }
  testing::internal::
  CmpHelperEQ<std::pair<phmap::priv::hash_internal::EnumClass_const,int>,std::pair<phmap::priv::hash_internal::EnumClass_const,int>>
            ((internal *)local_768,"val","*it",&local_728,
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)local_758._8_8_);
  if (local_768[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_788);
    if (local_760 == (Inner *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)(local_760->super_Lockable).super_mutex.super___mutex_base._M_mutex.__align;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_790,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x4c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_790,(Message *)&local_788);
    testing::internal::AssertHelper::~AssertHelper(&local_790);
    if (local_788._M_head_impl != (EnumClass *)0x0) {
      (**(code **)(*local_788._M_head_impl + 8))();
    }
  }
  if (local_760 != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_760,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_760);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::~parallel_hash_set(&local_718);
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, InsertHint) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  auto it = m.insert(m.end(), val);
  EXPECT_TRUE(it != m.end());
  EXPECT_EQ(val, *it);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  it = m.insert(it, val2);
  EXPECT_TRUE(it != m.end());
  EXPECT_EQ(val, *it);
}